

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS
ref_cavity_form_insert2
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node,REF_INT site,REF_INT protect,
          REF_INT faceid)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  REF_INT *pRVar3;
  uint uVar4;
  REF_STATUS RVar5;
  long lVar6;
  long lVar7;
  REF_INT item;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  REF_INT seg_nodes [3];
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  uint local_60;
  int local_44;
  int local_40;
  REF_INT local_3c;
  int local_38;
  int local_34;
  
  ref_node = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  iVar1 = ref_node->ref_mpi->id;
  if ((iVar1 == ref_node->part[node]) && (iVar1 == ref_node->part[site])) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      ref_cell = ref_grid->cell[3];
      uVar8 = 0xffffffff;
      if (-1 < site) {
        uVar8 = 0xffffffff;
        if (site < ref_cell->ref_adj->nnode) {
          uVar8 = (ulong)(uint)ref_cell->ref_adj->first[site];
        }
      }
      if ((int)uVar8 != -1) {
        item = ref_cell->ref_adj->item[(int)uVar8].ref;
        local_60 = 0;
        do {
          iVar1 = ref_cell->node_per;
          if (iVar1 < 1) {
LAB_0013350c:
            if ((faceid == -1) ||
               (bVar10 = false, ref_cell->c2n[ref_cell->size_per * item + iVar1] == faceid)) {
              uVar4 = ref_list_contains(ref_cavity->tri_list,item,&local_34);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x45e,"ref_cavity_form_insert2",(ulong)uVar4,"have tri?");
                local_60 = uVar4;
              }
              bVar10 = true;
              if (uVar4 == 0) {
                if (local_34 == 0) {
                  uVar4 = ref_list_push(ref_cavity->tri_list,item);
                  if (uVar4 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x460,"ref_cavity_form_insert2",(ulong)uVar4,"save tri");
                    local_60 = uVar4;
                  }
                  bVar10 = true;
                  if (uVar4 == 0) {
                    uVar4 = ref_cell_all_local(ref_cell,ref_node,item,&local_38);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x461,"ref_cavity_form_insert2",(ulong)uVar4,"local cell");
                      local_60 = uVar4;
                    }
                    bVar10 = true;
                    if (uVar4 == 0) {
                      if (local_38 == 0) {
                        ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                        local_60 = 0;
                      }
                      else {
                        pRVar3 = ref_cell->c2n;
                        lVar6 = (long)item;
                        lVar7 = ref_cell->size_per * lVar6;
                        local_3c = pRVar3[(long)(int)lVar7 + (long)ref_cell->node_per];
                        local_44 = pRVar3[lVar7 + 1];
                        local_40 = pRVar3[lVar7 + 2];
                        if ((local_40 == node || local_44 == node) ||
                           (uVar4 = ref_cavity_insert_seg(ref_cavity,&local_44), uVar4 == 0)) {
                          lVar7 = ref_cell->size_per * lVar6;
                          local_44 = ref_cell->c2n[lVar7 + 2];
                          local_40 = ref_cell->c2n[lVar7];
                          if (local_40 != node && local_44 != node) {
                            uVar4 = ref_cavity_insert_seg(ref_cavity,&local_44);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                     ,0x472,"ref_cavity_form_insert2",(ulong)uVar4,"tri side");
                              local_60 = uVar4;
                            }
                            bVar10 = true;
                            if (uVar4 != 0) goto LAB_001335da;
                          }
                          lVar6 = ref_cell->size_per * lVar6;
                          local_44 = ref_cell->c2n[lVar6];
                          local_40 = ref_cell->c2n[lVar6 + 1];
                          bVar10 = false;
                          if (local_40 != node && local_44 != node) {
                            uVar4 = ref_cavity_insert_seg(ref_cavity,&local_44);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                     ,0x478,"ref_cavity_form_insert2",(ulong)uVar4,"tri side");
                              local_60 = uVar4;
                            }
                            bVar10 = uVar4 != 0;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0x46c,"ref_cavity_form_insert2",(ulong)uVar4,"tri side");
                          bVar10 = true;
                          local_60 = uVar4;
                        }
                      }
                    }
                  }
                }
                else {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x45f,"ref_cavity_form_insert2","added tri twice?");
                  bVar10 = true;
                  local_60 = 1;
                }
              }
            }
          }
          else {
            lVar6 = 0;
            bVar9 = false;
            do {
              bVar10 = !bVar9;
              bVar9 = true;
              if (bVar10) {
                bVar9 = ref_cell->c2n[(long)ref_cell->size_per * (long)item + lVar6] == protect;
              }
              lVar6 = lVar6 + 1;
            } while (iVar1 != (int)lVar6);
            bVar10 = false;
            if (!bVar9) goto LAB_0013350c;
          }
LAB_001335da:
          if (bVar10) {
            return local_60;
          }
          pRVar2 = ref_cell->ref_adj->item;
          iVar1 = pRVar2[(int)uVar8].next;
          uVar8 = (ulong)iVar1;
          if (uVar8 == 0xffffffffffffffff) {
            item = -1;
          }
          else {
            item = pRVar2[uVar8].ref;
          }
        } while (iVar1 != -1);
      }
      if (ref_cavity->debug != 0) {
        ref_cavity_tec(ref_cavity,"form-tri.tec");
      }
      if (ref_cavity->debug != 0) {
        printf("insert form tri state %d\n",(ulong)ref_cavity->state);
      }
      RVar5 = ref_cavity_verify_seg_manifold(ref_cavity);
      if (RVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x480,"ref_cavity_form_insert2",1,"ball seg manifold");
        return 1;
      }
      if (ref_cavity->debug != 0) {
        printf("insert tri manifold state %d\n",(ulong)ref_cavity->state);
      }
      uVar4 = ref_cavity_enlarge_conforming(ref_cavity);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x484,"ref_cavity_form_insert2",(ulong)uVar4,"enlarge boundary");
        return uVar4;
      }
      if (ref_cavity->state != REF_CAVITY_VISIBLE) {
        return 1;
      }
      ref_cavity->state = REF_CAVITY_UNKNOWN;
      if (ref_cavity->debug != 0) {
        printf("insert tri conforming state %d\n",0);
      }
      uVar4 = ref_cavity_form_insert2_tet(ref_cavity,faceid);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x48c,"ref_cavity_form_insert2",(ulong)uVar4,"form tet ball");
        return uVar4;
      }
    }
    else {
      ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
    }
  }
  else {
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert2(REF_CAVITY ref_cavity,
                                           REF_GRID ref_grid, REF_INT node,
                                           REF_INT site, REF_INT protect,
                                           REF_INT faceid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell;
  REF_BOOL already_have_it, all_local, has_node;
  REF_INT seg_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node) || !ref_node_owned(ref_node, site)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    /* only insert tri with faceid if not empty */
    if (REF_EMPTY != faceid &&
        faceid != ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell))
      continue;
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tri?");
    RAS(!already_have_it, "added tri twice?");
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }

    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
  }

  if (ref_cavity_debug(ref_cavity)) ref_cavity_tec(ref_cavity, "form-tri.tec");

  if (ref_cavity_debug(ref_cavity))
    printf("insert form tri state %d\n", (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert tri manifold state %d\n", (int)ref_cavity_state(ref_cavity));

  RSS(ref_cavity_enlarge_conforming(ref_cavity), "enlarge boundary");
  if (REF_CAVITY_VISIBLE != ref_cavity_state(ref_cavity)) return REF_FAILURE;
  ref_cavity_state(ref_cavity) = REF_CAVITY_UNKNOWN;

  if (ref_cavity_debug(ref_cavity))
    printf("insert tri conforming state %d\n",
           (int)ref_cavity_state(ref_cavity));

  RSS(ref_cavity_form_insert2_tet(ref_cavity, faceid), "form tet ball");

  return REF_SUCCESS;
}